

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall
CLI::App::add_option_function<unsigned_long>
          (App *this,string *option_name,function<void_(const_unsigned_long_&)> *func,
          string *option_description)

{
  Option *this_00;
  anon_class_32_1_898bcfc2 fun;
  allocator local_d9;
  string local_d8;
  string local_b8;
  callback_t local_98;
  string local_78;
  function<void_(const_unsigned_long_&)> local_58;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::function<void_(const_unsigned_long_&)>::function(&local_58,func);
  ::std::__cxx11::string::string((string *)&local_78,(string *)option_name);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_option_function<unsigned_long>(std::__cxx11::string,std::function<void(unsigned_long_const&)>const&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&local_98,(anon_class_32_1_898bcfc2 *)&local_58);
  ::std::__cxx11::string::string((string *)&local_b8,(string *)option_description);
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  this_00 = add_option(this,&local_78,&local_98,&local_b8,false,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                        *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_b8);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string((string *)&local_d8,"UINT",&local_d9);
  Option::type_name(this_00,&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  this_00->type_size_max_ = 1;
  this_00->type_size_min_ = 1;
  this_00->expected_min_ = 1;
  this_00->expected_max_ = 1;
  this_00->flag_like_ = false;
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return this_00;
}

Assistant:

Option *add_option_function(std::string option_name,
                                const std::function<void(const ArgType &)> &func,  ///< the callback to execute
                                std::string option_description = "") {

        auto fun = [func](const CLI::results_t &res) {
            ArgType variable;
            bool result = detail::lexical_conversion<ArgType, ArgType>(res, variable);
            if(result) {
                func(variable);
            }
            return result;
        };

        Option *opt = add_option(option_name, std::move(fun), option_description, false);
        opt->type_name(detail::type_name<ArgType>());
        opt->type_size(detail::type_count_min<ArgType>::value, detail::type_count<ArgType>::value);
        opt->expected(detail::expected_count<ArgType>::value);
        return opt;
    }